

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

UChar32 anon_unknown.dwarf_23a1b9::getRange
                  (void *t,UChar32 start,UCPMapValueFilter *filter,void *context,uint32_t *pValue)

{
  long lVar1;
  bool bVar2;
  UCPTrieValueWidth valueWidth_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t highValue;
  int32_t di;
  int local_a4;
  uint32_t value2;
  int32_t di_2;
  int32_t dataMask;
  int32_t gi;
  int32_t group;
  int32_t block;
  int32_t i1;
  int32_t dataBlockLength;
  int32_t i3BlockLength;
  int32_t i3;
  int32_t i3Block;
  uint uStack_74;
  bool haveValue;
  uint32_t value;
  UChar32 c;
  int32_t prevBlock;
  int32_t prevI3Block;
  uint16_t *index;
  uint32_t nullValue;
  uint32_t local_4c;
  uint32_t value_1;
  int32_t di_1;
  UCPTrieValueWidth valueWidth;
  UCPTrie *trie;
  uint32_t *pValue_local;
  void *context_local;
  UCPMapValueFilter *filter_local;
  UChar32 start_local;
  void *t_local;
  
  if ((uint)start < 0x110000) {
    valueWidth_00 = (UCPTrieValueWidth)*(char *)((long)t + 0x1f);
    if (start < *(int *)((long)t + 0x18)) {
      index._4_4_ = *(uint32_t *)((long)t + 0x2c);
      if (filter != (UCPMapValueFilter *)0x0) {
        index._4_4_ = (*filter)(context,index._4_4_);
      }
      lVar1 = *t;
      c = -1;
      value = 0xffffffff;
      bVar2 = false;
      uStack_74 = start;
      do {
        if (((int)uStack_74 < 0x10000) &&
           ((*(char *)((long)t + 0x1e) == '\0' || ((int)uStack_74 < 0x1000)))) {
          i3BlockLength = 0;
          dataBlockLength = (int)uStack_74 >> 6;
          i1 = 0x40;
          if (*(char *)((long)t + 0x1e) == '\0') {
            i1 = 0x400;
          }
          block = 0x40;
LAB_0036bb96:
          do {
            if ((i3BlockLength & 0x8000U) == 0) {
              gi = (int32_t)*(ushort *)(lVar1 + (long)(i3BlockLength + dataBlockLength) * 2);
            }
            else {
              iVar3 = (i3BlockLength & 0x7fffU) + (dataBlockLength & 0xfffffff8U) +
                      (dataBlockLength >> 3);
              gi = (uint)*(ushort *)(lVar1 + (long)(int)(iVar3 + 1 + (dataBlockLength & 7U)) * 2) |
                   (uint)*(ushort *)(lVar1 + (long)iVar3 * 2) <<
                   (char)((dataBlockLength & 7U) << 1) + 2 & 0x30000;
            }
            if ((gi == value) && (block <= (int)(uStack_74 - start))) {
              uVar5 = block + uStack_74;
            }
            else {
              uVar4 = block - 1;
              value = gi;
              if (gi == *(int *)((long)t + 0x28)) {
                if (bVar2) {
                  if (index._4_4_ != i3Block) {
                    return uStack_74 - 1;
                  }
                }
                else {
                  i3Block = index._4_4_;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = index._4_4_;
                  }
                  bVar2 = true;
                }
                uVar5 = uStack_74 + block & (uVar4 ^ 0xffffffff);
              }
              else {
                local_a4 = gi + (uStack_74 & uVar4);
                uVar6 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth_00,local_a4);
                uVar6 = maybeFilterValue(uVar6,*(uint32_t *)((long)t + 0x2c),index._4_4_,filter,
                                         context);
                if (bVar2) {
                  uVar5 = uStack_74;
                  if (uVar6 != i3Block) {
                    return uStack_74 - 1;
                  }
                }
                else {
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar6;
                  }
                  bVar2 = true;
                  uVar5 = uStack_74;
                  i3Block = uVar6;
                }
                while (uStack_74 = uVar5, uVar5 = uStack_74 + 1, (uVar5 & uVar4) != 0) {
                  local_a4 = local_a4 + 1;
                  uVar6 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth_00,local_a4);
                  uVar6 = maybeFilterValue(uVar6,*(uint32_t *)((long)t + 0x2c),index._4_4_,filter,
                                           context);
                  if (uVar6 != i3Block) {
                    return uStack_74;
                  }
                }
              }
            }
            uStack_74 = uVar5;
            dataBlockLength = dataBlockLength + 1;
          } while (dataBlockLength < i1);
        }
        else {
          if (*(char *)((long)t + 0x1e) == '\0') {
            group = ((int)uStack_74 >> 0xe) + 0x3fc;
          }
          else {
            group = ((int)uStack_74 >> 0xe) + 0x40;
          }
          i3BlockLength =
               (int32_t)*(ushort *)
                         (*t + (long)(int)((uint)*(ushort *)(*t + (long)group * 2) +
                                          ((int)uStack_74 >> 9 & 0x1fU)) * 2);
          if ((i3BlockLength == c) && (0x1ff < (int)(uStack_74 - start))) {
            uStack_74 = uStack_74 + 0x200;
          }
          else {
            c = i3BlockLength;
            if (i3BlockLength != (uint)*(ushort *)((long)t + 0x26)) {
              dataBlockLength = (int)uStack_74 >> 4 & 0x1f;
              i1 = 0x20;
              block = 0x10;
              goto LAB_0036bb96;
            }
            if (bVar2) {
              if (index._4_4_ != i3Block) {
                return uStack_74 - 1;
              }
            }
            else {
              i3Block = index._4_4_;
              if (pValue != (uint32_t *)0x0) {
                *pValue = index._4_4_;
              }
              bVar2 = true;
            }
            value = *(uint32_t *)((long)t + 0x28);
            uStack_74 = uStack_74 + 0x200 & 0xfffffe00;
          }
        }
      } while ((int)uStack_74 < *(int *)((long)t + 0x18));
      uVar6 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth_00,*(int *)((long)t + 0x14) + -2);
      uVar6 = maybeFilterValue(uVar6,*(uint32_t *)((long)t + 0x2c),index._4_4_,filter,context);
      if (uVar6 == i3Block) {
        t_local._4_4_ = 0x10ffff;
      }
      else {
        t_local._4_4_ = uStack_74 - 1;
      }
    }
    else {
      if (pValue != (uint32_t *)0x0) {
        local_4c = getValue(*(UCPTrieData *)((long)t + 8),valueWidth_00,
                            *(int *)((long)t + 0x14) + -2);
        if (filter != (UCPMapValueFilter *)0x0) {
          local_4c = (*filter)(context,local_4c);
        }
        *pValue = local_4c;
      }
      t_local._4_4_ = 0x10ffff;
    }
  }
  else {
    t_local._4_4_ = -1;
  }
  return t_local._4_4_;
}

Assistant:

UChar32 getRange(const void *trie, UChar32 start,
                 UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    return reinterpret_cast<const MutableCodePointTrie *>(trie)->
        getRange(start, filter, context, pValue);
}